

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase48::run(TestCase48 *this)

{
  bool bVar1;
  NullableValue<kj::HttpMethod> *pNVar2;
  HttpMethod *pHVar3;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  StringPtr name_10;
  StringPtr name_11;
  StringPtr name_12;
  StringPtr name_13;
  StringPtr name_14;
  StringPtr name_15;
  StringPtr name_16;
  StringPtr name_17;
  StringPtr name_18;
  StringPtr name_19;
  StringPtr name_20;
  StringPtr name_21;
  StringPtr name_22;
  StringPtr name_23;
  StringPtr name_24;
  StringPtr name_25;
  StringPtr name_26;
  StringPtr name_27;
  StringPtr name_28;
  StringPtr name_29;
  StringPtr name_30;
  bool local_a91;
  undefined1 auStack_a90 [7];
  bool _kj_shouldLog_83;
  Maybe<kj::HttpMethod> local_a7c;
  bool local_a71;
  undefined1 auStack_a70 [7];
  bool _kj_shouldLog_82;
  Maybe<kj::HttpMethod> local_a5c;
  bool local_a51;
  undefined1 auStack_a50 [7];
  bool _kj_shouldLog_81;
  Maybe<kj::HttpMethod> local_a3c;
  bool local_a31;
  undefined1 auStack_a30 [7];
  bool _kj_shouldLog_80;
  Maybe<kj::HttpMethod> local_a1c;
  bool local_a11;
  undefined1 auStack_a10 [7];
  bool _kj_shouldLog_79;
  Maybe<kj::HttpMethod> local_9fc;
  bool local_9f1;
  undefined1 auStack_9f0 [7];
  bool _kj_shouldLog_78;
  Maybe<kj::HttpMethod> local_9dc;
  bool local_9d2;
  bool local_9d1;
  undefined1 auStack_9d0 [6];
  bool _kj_shouldLog_77;
  bool _kj_shouldLog_76;
  Maybe<kj::HttpMethod> local_9bc;
  NullableValue<kj::HttpMethod> local_9b4;
  NullableValue<kj::HttpMethod> parsed_25;
  bool _kj_shouldLog_75;
  HttpMethod local_994;
  String local_990;
  bool local_972;
  bool local_971;
  undefined1 auStack_970 [6];
  bool _kj_shouldLog_74;
  bool _kj_shouldLog_73;
  Maybe<kj::HttpMethod> local_95c;
  NullableValue<kj::HttpMethod> local_954;
  NullableValue<kj::HttpMethod> parsed_24;
  bool _kj_shouldLog_72;
  HttpMethod local_934;
  String local_930;
  bool local_912;
  bool local_911;
  undefined1 auStack_910 [6];
  bool _kj_shouldLog_71;
  bool _kj_shouldLog_70;
  Maybe<kj::HttpMethod> local_8fc;
  NullableValue<kj::HttpMethod> local_8f4;
  NullableValue<kj::HttpMethod> parsed_23;
  bool _kj_shouldLog_69;
  HttpMethod local_8d4;
  String local_8d0;
  bool local_8b2;
  bool local_8b1;
  undefined1 auStack_8b0 [6];
  bool _kj_shouldLog_68;
  bool _kj_shouldLog_67;
  Maybe<kj::HttpMethod> local_89c;
  NullableValue<kj::HttpMethod> local_894;
  NullableValue<kj::HttpMethod> parsed_22;
  bool _kj_shouldLog_66;
  HttpMethod local_874;
  String local_870;
  bool local_852;
  bool local_851;
  undefined1 auStack_850 [6];
  bool _kj_shouldLog_65;
  bool _kj_shouldLog_64;
  Maybe<kj::HttpMethod> local_83c;
  NullableValue<kj::HttpMethod> local_834;
  NullableValue<kj::HttpMethod> parsed_21;
  bool _kj_shouldLog_63;
  HttpMethod local_814;
  String local_810;
  bool local_7f2;
  bool local_7f1;
  undefined1 auStack_7f0 [6];
  bool _kj_shouldLog_62;
  bool _kj_shouldLog_61;
  Maybe<kj::HttpMethod> local_7dc;
  NullableValue<kj::HttpMethod> local_7d4;
  NullableValue<kj::HttpMethod> parsed_20;
  bool _kj_shouldLog_60;
  HttpMethod local_7b4;
  String local_7b0;
  bool local_792;
  bool local_791;
  undefined1 auStack_790 [6];
  bool _kj_shouldLog_59;
  bool _kj_shouldLog_58;
  Maybe<kj::HttpMethod> local_77c;
  NullableValue<kj::HttpMethod> local_774;
  NullableValue<kj::HttpMethod> parsed_19;
  bool _kj_shouldLog_57;
  HttpMethod local_754;
  String local_750;
  bool local_732;
  bool local_731;
  undefined1 auStack_730 [6];
  bool _kj_shouldLog_56;
  bool _kj_shouldLog_55;
  Maybe<kj::HttpMethod> local_71c;
  NullableValue<kj::HttpMethod> local_714;
  NullableValue<kj::HttpMethod> parsed_18;
  bool _kj_shouldLog_54;
  HttpMethod local_6f4;
  String local_6f0;
  bool local_6d2;
  bool local_6d1;
  undefined1 auStack_6d0 [6];
  bool _kj_shouldLog_53;
  bool _kj_shouldLog_52;
  Maybe<kj::HttpMethod> local_6bc;
  NullableValue<kj::HttpMethod> local_6b4;
  NullableValue<kj::HttpMethod> parsed_17;
  bool _kj_shouldLog_51;
  HttpMethod local_694;
  String local_690;
  bool local_672;
  bool local_671;
  undefined1 auStack_670 [6];
  bool _kj_shouldLog_50;
  bool _kj_shouldLog_49;
  Maybe<kj::HttpMethod> local_65c;
  NullableValue<kj::HttpMethod> local_654;
  NullableValue<kj::HttpMethod> parsed_16;
  bool _kj_shouldLog_48;
  HttpMethod local_634;
  String local_630;
  bool local_612;
  bool local_611;
  undefined1 auStack_610 [6];
  bool _kj_shouldLog_47;
  bool _kj_shouldLog_46;
  Maybe<kj::HttpMethod> local_5fc;
  NullableValue<kj::HttpMethod> local_5f4;
  NullableValue<kj::HttpMethod> parsed_15;
  bool _kj_shouldLog_45;
  HttpMethod local_5d4;
  String local_5d0;
  bool local_5b2;
  bool local_5b1;
  undefined1 auStack_5b0 [6];
  bool _kj_shouldLog_44;
  bool _kj_shouldLog_43;
  Maybe<kj::HttpMethod> local_59c;
  NullableValue<kj::HttpMethod> local_594;
  NullableValue<kj::HttpMethod> parsed_14;
  bool _kj_shouldLog_42;
  HttpMethod local_574;
  String local_570;
  bool local_552;
  bool local_551;
  undefined1 auStack_550 [6];
  bool _kj_shouldLog_41;
  bool _kj_shouldLog_40;
  Maybe<kj::HttpMethod> local_53c;
  NullableValue<kj::HttpMethod> local_534;
  NullableValue<kj::HttpMethod> parsed_13;
  bool _kj_shouldLog_39;
  HttpMethod local_514;
  String local_510;
  bool local_4f2;
  bool local_4f1;
  undefined1 auStack_4f0 [6];
  bool _kj_shouldLog_38;
  bool _kj_shouldLog_37;
  Maybe<kj::HttpMethod> local_4dc;
  NullableValue<kj::HttpMethod> local_4d4;
  NullableValue<kj::HttpMethod> parsed_12;
  bool _kj_shouldLog_36;
  HttpMethod local_4b4;
  String local_4b0;
  bool local_492;
  bool local_491;
  undefined1 auStack_490 [6];
  bool _kj_shouldLog_35;
  bool _kj_shouldLog_34;
  Maybe<kj::HttpMethod> local_47c;
  NullableValue<kj::HttpMethod> local_474;
  NullableValue<kj::HttpMethod> parsed_11;
  bool _kj_shouldLog_33;
  HttpMethod local_454;
  String local_450;
  bool local_432;
  bool local_431;
  undefined1 auStack_430 [6];
  bool _kj_shouldLog_32;
  bool _kj_shouldLog_31;
  Maybe<kj::HttpMethod> local_41c;
  NullableValue<kj::HttpMethod> local_414;
  NullableValue<kj::HttpMethod> parsed_10;
  bool _kj_shouldLog_30;
  HttpMethod local_3f4;
  String local_3f0;
  bool local_3d2;
  bool local_3d1;
  undefined1 auStack_3d0 [6];
  bool _kj_shouldLog_29;
  bool _kj_shouldLog_28;
  Maybe<kj::HttpMethod> local_3bc;
  NullableValue<kj::HttpMethod> local_3b4;
  NullableValue<kj::HttpMethod> parsed_9;
  bool _kj_shouldLog_27;
  HttpMethod local_394;
  String local_390;
  bool local_372;
  bool local_371;
  undefined1 auStack_370 [6];
  bool _kj_shouldLog_26;
  bool _kj_shouldLog_25;
  Maybe<kj::HttpMethod> local_35c;
  NullableValue<kj::HttpMethod> local_354;
  NullableValue<kj::HttpMethod> parsed_8;
  bool _kj_shouldLog_24;
  HttpMethod local_334;
  String local_330;
  bool local_312;
  bool local_311;
  undefined1 auStack_310 [6];
  bool _kj_shouldLog_23;
  bool _kj_shouldLog_22;
  Maybe<kj::HttpMethod> local_2fc;
  NullableValue<kj::HttpMethod> local_2f4;
  NullableValue<kj::HttpMethod> parsed_7;
  bool _kj_shouldLog_21;
  HttpMethod local_2d4;
  String local_2d0;
  bool local_2b2;
  bool local_2b1;
  undefined1 auStack_2b0 [6];
  bool _kj_shouldLog_20;
  bool _kj_shouldLog_19;
  Maybe<kj::HttpMethod> local_29c;
  NullableValue<kj::HttpMethod> local_294;
  NullableValue<kj::HttpMethod> parsed_6;
  bool _kj_shouldLog_18;
  HttpMethod local_274;
  String local_270;
  bool local_252;
  bool local_251;
  undefined1 auStack_250 [6];
  bool _kj_shouldLog_17;
  bool _kj_shouldLog_16;
  Maybe<kj::HttpMethod> local_23c;
  NullableValue<kj::HttpMethod> local_234;
  NullableValue<kj::HttpMethod> parsed_5;
  bool _kj_shouldLog_15;
  HttpMethod local_214;
  String local_210;
  bool local_1f2;
  bool local_1f1;
  undefined1 auStack_1f0 [6];
  bool _kj_shouldLog_14;
  bool _kj_shouldLog_13;
  Maybe<kj::HttpMethod> local_1dc;
  NullableValue<kj::HttpMethod> local_1d4;
  NullableValue<kj::HttpMethod> parsed_4;
  bool _kj_shouldLog_12;
  HttpMethod local_1b4;
  String local_1b0;
  bool local_192;
  bool local_191;
  undefined1 auStack_190 [6];
  bool _kj_shouldLog_11;
  bool _kj_shouldLog_10;
  Maybe<kj::HttpMethod> local_17c;
  NullableValue<kj::HttpMethod> local_174;
  NullableValue<kj::HttpMethod> parsed_3;
  bool _kj_shouldLog_9;
  HttpMethod local_154;
  String local_150;
  bool local_132;
  bool local_131;
  undefined1 auStack_130 [6];
  bool _kj_shouldLog_8;
  bool _kj_shouldLog_7;
  Maybe<kj::HttpMethod> local_11c;
  NullableValue<kj::HttpMethod> local_114;
  NullableValue<kj::HttpMethod> parsed_2;
  bool _kj_shouldLog_6;
  HttpMethod local_f4;
  String local_f0;
  bool local_d2;
  bool local_d1;
  undefined1 auStack_d0 [6];
  bool _kj_shouldLog_5;
  bool _kj_shouldLog_4;
  Maybe<kj::HttpMethod> local_bc;
  NullableValue<kj::HttpMethod> local_b4;
  NullableValue<kj::HttpMethod> parsed_1;
  bool _kj_shouldLog_3;
  HttpMethod local_94;
  String local_90;
  bool local_72;
  bool local_71;
  undefined1 auStack_70 [6];
  bool _kj_shouldLog_2;
  bool _kj_shouldLog_1;
  Maybe<kj::HttpMethod> local_60;
  NullableValue<kj::HttpMethod> local_58;
  NullableValue<kj::HttpMethod> parsed;
  bool _kj_shouldLog;
  StringPtr local_40;
  HttpMethod local_2c;
  String local_28;
  TestCase48 *local_10;
  TestCase48 *this_local;
  
  local_2c = GET;
  local_10 = this;
  str<kj::HttpMethod>(&local_28,&local_2c);
  StringPtr::StringPtr(&local_40,"GET");
  bVar1 = String::operator==(&local_28,&local_40);
  String::~String(&local_28);
  if (!bVar1) {
    parsed._3_1_ = _::Debug::shouldLog(ERROR);
    while (parsed._3_1_ != '\0') {
      _::Debug::log<char_const(&)[51]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::GET) == \\\"GET\\\"\"",
                 (char (*) [51])"failed: expected kj::str(HttpMethod::GET) == \"GET\"");
      parsed._3_1_ = 0;
    }
  }
  StringPtr::StringPtr((StringPtr *)auStack_70,"GET");
  name.content.size_ = (size_t)_auStack_70;
  name.content.ptr = (char *)&local_60;
  tryParseHttpMethod(name);
  pNVar2 = _::readMaybe<kj::HttpMethod>(&local_60);
  _::NullableValue<kj::HttpMethod>::NullableValue(&local_58,pNVar2);
  Maybe<kj::HttpMethod>::~Maybe(&local_60);
  pHVar3 = _::NullableValue::operator_cast_to_HttpMethod_((NullableValue *)&local_58);
  if (pHVar3 == (HttpMethod *)0x0) {
    local_72 = _::Debug::shouldLog(ERROR);
    while (local_72 != false) {
      _::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"GET\" \"\\\" as HttpMethod\"",
                 (char (*) [35])"couldn\'t parse \"GET\" as HttpMethod");
      local_72 = false;
    }
  }
  else {
    pHVar3 = _::NullableValue<kj::HttpMethod>::operator*(&local_58);
    if (*pHVar3 != GET) {
      local_71 = _::Debug::shouldLog(ERROR);
      while (local_71 != false) {
        _::Debug::log<char_const(&)[44]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::GET\"",
                   (char (*) [44])"failed: expected *parsed == HttpMethod::GET");
        local_71 = false;
      }
    }
  }
  _::NullableValue<kj::HttpMethod>::~NullableValue(&local_58);
  local_94 = HEAD;
  str<kj::HttpMethod>(&local_90,&local_94);
  StringPtr::StringPtr((StringPtr *)&parsed_1.field_1,"HEAD");
  bVar1 = String::operator==(&local_90,(StringPtr *)&parsed_1.field_1);
  String::~String(&local_90);
  if (!bVar1) {
    parsed_1._3_1_ = _::Debug::shouldLog(ERROR);
    while (parsed_1._3_1_ != '\0') {
      _::Debug::log<char_const(&)[53]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::HEAD) == \\\"HEAD\\\"\"",
                 (char (*) [53])"failed: expected kj::str(HttpMethod::HEAD) == \"HEAD\"");
      parsed_1._3_1_ = 0;
    }
  }
  StringPtr::StringPtr((StringPtr *)auStack_d0,"HEAD");
  name_00.content.size_ = (size_t)_auStack_d0;
  name_00.content.ptr = (char *)&local_bc;
  tryParseHttpMethod(name_00);
  pNVar2 = _::readMaybe<kj::HttpMethod>(&local_bc);
  _::NullableValue<kj::HttpMethod>::NullableValue(&local_b4,pNVar2);
  Maybe<kj::HttpMethod>::~Maybe(&local_bc);
  pHVar3 = _::NullableValue::operator_cast_to_HttpMethod_((NullableValue *)&local_b4);
  if (pHVar3 == (HttpMethod *)0x0) {
    local_d2 = _::Debug::shouldLog(ERROR);
    while (local_d2 != false) {
      _::Debug::log<char_const(&)[36]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"HEAD\" \"\\\" as HttpMethod\"",
                 (char (*) [36])"couldn\'t parse \"HEAD\" as HttpMethod");
      local_d2 = false;
    }
  }
  else {
    pHVar3 = _::NullableValue<kj::HttpMethod>::operator*(&local_b4);
    if (*pHVar3 != HEAD) {
      local_d1 = _::Debug::shouldLog(ERROR);
      while (local_d1 != false) {
        _::Debug::log<char_const(&)[45]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::HEAD\"",
                   (char (*) [45])"failed: expected *parsed == HttpMethod::HEAD");
        local_d1 = false;
      }
    }
  }
  _::NullableValue<kj::HttpMethod>::~NullableValue(&local_b4);
  local_f4 = POST;
  str<kj::HttpMethod>(&local_f0,&local_f4);
  StringPtr::StringPtr((StringPtr *)&parsed_2.field_1,"POST");
  bVar1 = String::operator==(&local_f0,(StringPtr *)&parsed_2.field_1);
  String::~String(&local_f0);
  if (!bVar1) {
    parsed_2._3_1_ = _::Debug::shouldLog(ERROR);
    while (parsed_2._3_1_ != '\0') {
      _::Debug::log<char_const(&)[53]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::POST) == \\\"POST\\\"\"",
                 (char (*) [53])"failed: expected kj::str(HttpMethod::POST) == \"POST\"");
      parsed_2._3_1_ = 0;
    }
  }
  StringPtr::StringPtr((StringPtr *)auStack_130,"POST");
  name_01.content.size_ = (size_t)_auStack_130;
  name_01.content.ptr = (char *)&local_11c;
  tryParseHttpMethod(name_01);
  pNVar2 = _::readMaybe<kj::HttpMethod>(&local_11c);
  _::NullableValue<kj::HttpMethod>::NullableValue(&local_114,pNVar2);
  Maybe<kj::HttpMethod>::~Maybe(&local_11c);
  pHVar3 = _::NullableValue::operator_cast_to_HttpMethod_((NullableValue *)&local_114);
  if (pHVar3 == (HttpMethod *)0x0) {
    local_132 = _::Debug::shouldLog(ERROR);
    while (local_132 != false) {
      _::Debug::log<char_const(&)[36]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"POST\" \"\\\" as HttpMethod\"",
                 (char (*) [36])"couldn\'t parse \"POST\" as HttpMethod");
      local_132 = false;
    }
  }
  else {
    pHVar3 = _::NullableValue<kj::HttpMethod>::operator*(&local_114);
    if (*pHVar3 != POST) {
      local_131 = _::Debug::shouldLog(ERROR);
      while (local_131 != false) {
        _::Debug::log<char_const(&)[45]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::POST\"",
                   (char (*) [45])"failed: expected *parsed == HttpMethod::POST");
        local_131 = false;
      }
    }
  }
  _::NullableValue<kj::HttpMethod>::~NullableValue(&local_114);
  local_154 = PUT;
  str<kj::HttpMethod>(&local_150,&local_154);
  StringPtr::StringPtr((StringPtr *)&parsed_3.field_1,"PUT");
  bVar1 = String::operator==(&local_150,(StringPtr *)&parsed_3.field_1);
  String::~String(&local_150);
  if (!bVar1) {
    parsed_3._3_1_ = _::Debug::shouldLog(ERROR);
    while (parsed_3._3_1_ != '\0') {
      _::Debug::log<char_const(&)[51]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::PUT) == \\\"PUT\\\"\"",
                 (char (*) [51])"failed: expected kj::str(HttpMethod::PUT) == \"PUT\"");
      parsed_3._3_1_ = 0;
    }
  }
  StringPtr::StringPtr((StringPtr *)auStack_190,"PUT");
  name_02.content.size_ = (size_t)_auStack_190;
  name_02.content.ptr = (char *)&local_17c;
  tryParseHttpMethod(name_02);
  pNVar2 = _::readMaybe<kj::HttpMethod>(&local_17c);
  _::NullableValue<kj::HttpMethod>::NullableValue(&local_174,pNVar2);
  Maybe<kj::HttpMethod>::~Maybe(&local_17c);
  pHVar3 = _::NullableValue::operator_cast_to_HttpMethod_((NullableValue *)&local_174);
  if (pHVar3 == (HttpMethod *)0x0) {
    local_192 = _::Debug::shouldLog(ERROR);
    while (local_192 != false) {
      _::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"PUT\" \"\\\" as HttpMethod\"",
                 (char (*) [35])"couldn\'t parse \"PUT\" as HttpMethod");
      local_192 = false;
    }
  }
  else {
    pHVar3 = _::NullableValue<kj::HttpMethod>::operator*(&local_174);
    if (*pHVar3 != PUT) {
      local_191 = _::Debug::shouldLog(ERROR);
      while (local_191 != false) {
        _::Debug::log<char_const(&)[44]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::PUT\"",
                   (char (*) [44])"failed: expected *parsed == HttpMethod::PUT");
        local_191 = false;
      }
    }
  }
  _::NullableValue<kj::HttpMethod>::~NullableValue(&local_174);
  local_1b4 = DELETE;
  str<kj::HttpMethod>(&local_1b0,&local_1b4);
  StringPtr::StringPtr((StringPtr *)&parsed_4.field_1,"DELETE");
  bVar1 = String::operator==(&local_1b0,(StringPtr *)&parsed_4.field_1);
  String::~String(&local_1b0);
  if (!bVar1) {
    parsed_4._3_1_ = _::Debug::shouldLog(ERROR);
    while (parsed_4._3_1_ != '\0') {
      _::Debug::log<char_const(&)[57]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,
                 "\"failed: expected \" \"kj::str(HttpMethod::DELETE) == \\\"DELETE\\\"\"",
                 (char (*) [57])"failed: expected kj::str(HttpMethod::DELETE) == \"DELETE\"");
      parsed_4._3_1_ = 0;
    }
  }
  StringPtr::StringPtr((StringPtr *)auStack_1f0,"DELETE");
  name_03.content.size_ = (size_t)_auStack_1f0;
  name_03.content.ptr = (char *)&local_1dc;
  tryParseHttpMethod(name_03);
  pNVar2 = _::readMaybe<kj::HttpMethod>(&local_1dc);
  _::NullableValue<kj::HttpMethod>::NullableValue(&local_1d4,pNVar2);
  Maybe<kj::HttpMethod>::~Maybe(&local_1dc);
  pHVar3 = _::NullableValue::operator_cast_to_HttpMethod_((NullableValue *)&local_1d4);
  if (pHVar3 == (HttpMethod *)0x0) {
    local_1f2 = _::Debug::shouldLog(ERROR);
    while (local_1f2 != false) {
      _::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"DELETE\" \"\\\" as HttpMethod\"",
                 (char (*) [38])"couldn\'t parse \"DELETE\" as HttpMethod");
      local_1f2 = false;
    }
  }
  else {
    pHVar3 = _::NullableValue<kj::HttpMethod>::operator*(&local_1d4);
    if (*pHVar3 != DELETE) {
      local_1f1 = _::Debug::shouldLog(ERROR);
      while (local_1f1 != false) {
        _::Debug::log<char_const(&)[47]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::DELETE\"",
                   (char (*) [47])"failed: expected *parsed == HttpMethod::DELETE");
        local_1f1 = false;
      }
    }
  }
  _::NullableValue<kj::HttpMethod>::~NullableValue(&local_1d4);
  local_214 = PATCH;
  str<kj::HttpMethod>(&local_210,&local_214);
  StringPtr::StringPtr((StringPtr *)&parsed_5.field_1,"PATCH");
  bVar1 = String::operator==(&local_210,(StringPtr *)&parsed_5.field_1);
  String::~String(&local_210);
  if (!bVar1) {
    parsed_5._3_1_ = _::Debug::shouldLog(ERROR);
    while (parsed_5._3_1_ != '\0') {
      _::Debug::log<char_const(&)[55]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::PATCH) == \\\"PATCH\\\"\""
                 ,(char (*) [55])"failed: expected kj::str(HttpMethod::PATCH) == \"PATCH\"");
      parsed_5._3_1_ = 0;
    }
  }
  StringPtr::StringPtr((StringPtr *)auStack_250,"PATCH");
  name_04.content.size_ = (size_t)_auStack_250;
  name_04.content.ptr = (char *)&local_23c;
  tryParseHttpMethod(name_04);
  pNVar2 = _::readMaybe<kj::HttpMethod>(&local_23c);
  _::NullableValue<kj::HttpMethod>::NullableValue(&local_234,pNVar2);
  Maybe<kj::HttpMethod>::~Maybe(&local_23c);
  pHVar3 = _::NullableValue::operator_cast_to_HttpMethod_((NullableValue *)&local_234);
  if (pHVar3 == (HttpMethod *)0x0) {
    local_252 = _::Debug::shouldLog(ERROR);
    while (local_252 != false) {
      _::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"PATCH\" \"\\\" as HttpMethod\"",
                 (char (*) [37])"couldn\'t parse \"PATCH\" as HttpMethod");
      local_252 = false;
    }
  }
  else {
    pHVar3 = _::NullableValue<kj::HttpMethod>::operator*(&local_234);
    if (*pHVar3 != PATCH) {
      local_251 = _::Debug::shouldLog(ERROR);
      while (local_251 != false) {
        _::Debug::log<char_const(&)[46]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::PATCH\"",
                   (char (*) [46])"failed: expected *parsed == HttpMethod::PATCH");
        local_251 = false;
      }
    }
  }
  _::NullableValue<kj::HttpMethod>::~NullableValue(&local_234);
  local_274 = PURGE;
  str<kj::HttpMethod>(&local_270,&local_274);
  StringPtr::StringPtr((StringPtr *)&parsed_6.field_1,"PURGE");
  bVar1 = String::operator==(&local_270,(StringPtr *)&parsed_6.field_1);
  String::~String(&local_270);
  if (!bVar1) {
    parsed_6._3_1_ = _::Debug::shouldLog(ERROR);
    while (parsed_6._3_1_ != '\0') {
      _::Debug::log<char_const(&)[55]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::PURGE) == \\\"PURGE\\\"\""
                 ,(char (*) [55])"failed: expected kj::str(HttpMethod::PURGE) == \"PURGE\"");
      parsed_6._3_1_ = 0;
    }
  }
  StringPtr::StringPtr((StringPtr *)auStack_2b0,"PURGE");
  name_05.content.size_ = (size_t)_auStack_2b0;
  name_05.content.ptr = (char *)&local_29c;
  tryParseHttpMethod(name_05);
  pNVar2 = _::readMaybe<kj::HttpMethod>(&local_29c);
  _::NullableValue<kj::HttpMethod>::NullableValue(&local_294,pNVar2);
  Maybe<kj::HttpMethod>::~Maybe(&local_29c);
  pHVar3 = _::NullableValue::operator_cast_to_HttpMethod_((NullableValue *)&local_294);
  if (pHVar3 == (HttpMethod *)0x0) {
    local_2b2 = _::Debug::shouldLog(ERROR);
    while (local_2b2 != false) {
      _::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"PURGE\" \"\\\" as HttpMethod\"",
                 (char (*) [37])"couldn\'t parse \"PURGE\" as HttpMethod");
      local_2b2 = false;
    }
  }
  else {
    pHVar3 = _::NullableValue<kj::HttpMethod>::operator*(&local_294);
    if (*pHVar3 != PURGE) {
      local_2b1 = _::Debug::shouldLog(ERROR);
      while (local_2b1 != false) {
        _::Debug::log<char_const(&)[46]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::PURGE\"",
                   (char (*) [46])"failed: expected *parsed == HttpMethod::PURGE");
        local_2b1 = false;
      }
    }
  }
  _::NullableValue<kj::HttpMethod>::~NullableValue(&local_294);
  local_2d4 = OPTIONS;
  str<kj::HttpMethod>(&local_2d0,&local_2d4);
  StringPtr::StringPtr((StringPtr *)&parsed_7.field_1,"OPTIONS");
  bVar1 = String::operator==(&local_2d0,(StringPtr *)&parsed_7.field_1);
  String::~String(&local_2d0);
  if (!bVar1) {
    parsed_7._3_1_ = _::Debug::shouldLog(ERROR);
    while (parsed_7._3_1_ != '\0') {
      _::Debug::log<char_const(&)[59]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,
                 "\"failed: expected \" \"kj::str(HttpMethod::OPTIONS) == \\\"OPTIONS\\\"\"",
                 (char (*) [59])"failed: expected kj::str(HttpMethod::OPTIONS) == \"OPTIONS\"");
      parsed_7._3_1_ = 0;
    }
  }
  StringPtr::StringPtr((StringPtr *)auStack_310,"OPTIONS");
  name_06.content.size_ = (size_t)_auStack_310;
  name_06.content.ptr = (char *)&local_2fc;
  tryParseHttpMethod(name_06);
  pNVar2 = _::readMaybe<kj::HttpMethod>(&local_2fc);
  _::NullableValue<kj::HttpMethod>::NullableValue(&local_2f4,pNVar2);
  Maybe<kj::HttpMethod>::~Maybe(&local_2fc);
  pHVar3 = _::NullableValue::operator_cast_to_HttpMethod_((NullableValue *)&local_2f4);
  if (pHVar3 == (HttpMethod *)0x0) {
    local_312 = _::Debug::shouldLog(ERROR);
    while (local_312 != false) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"OPTIONS\" \"\\\" as HttpMethod\"",
                 (char (*) [39])"couldn\'t parse \"OPTIONS\" as HttpMethod");
      local_312 = false;
    }
  }
  else {
    pHVar3 = _::NullableValue<kj::HttpMethod>::operator*(&local_2f4);
    if (*pHVar3 != OPTIONS) {
      local_311 = _::Debug::shouldLog(ERROR);
      while (local_311 != false) {
        _::Debug::log<char_const(&)[48]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::OPTIONS\"",
                   (char (*) [48])"failed: expected *parsed == HttpMethod::OPTIONS");
        local_311 = false;
      }
    }
  }
  _::NullableValue<kj::HttpMethod>::~NullableValue(&local_2f4);
  local_334 = TRACE;
  str<kj::HttpMethod>(&local_330,&local_334);
  StringPtr::StringPtr((StringPtr *)&parsed_8.field_1,"TRACE");
  bVar1 = String::operator==(&local_330,(StringPtr *)&parsed_8.field_1);
  String::~String(&local_330);
  if (!bVar1) {
    parsed_8._3_1_ = _::Debug::shouldLog(ERROR);
    while (parsed_8._3_1_ != '\0') {
      _::Debug::log<char_const(&)[55]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::TRACE) == \\\"TRACE\\\"\""
                 ,(char (*) [55])"failed: expected kj::str(HttpMethod::TRACE) == \"TRACE\"");
      parsed_8._3_1_ = 0;
    }
  }
  StringPtr::StringPtr((StringPtr *)auStack_370,"TRACE");
  name_07.content.size_ = (size_t)_auStack_370;
  name_07.content.ptr = (char *)&local_35c;
  tryParseHttpMethod(name_07);
  pNVar2 = _::readMaybe<kj::HttpMethod>(&local_35c);
  _::NullableValue<kj::HttpMethod>::NullableValue(&local_354,pNVar2);
  Maybe<kj::HttpMethod>::~Maybe(&local_35c);
  pHVar3 = _::NullableValue::operator_cast_to_HttpMethod_((NullableValue *)&local_354);
  if (pHVar3 == (HttpMethod *)0x0) {
    local_372 = _::Debug::shouldLog(ERROR);
    while (local_372 != false) {
      _::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"TRACE\" \"\\\" as HttpMethod\"",
                 (char (*) [37])"couldn\'t parse \"TRACE\" as HttpMethod");
      local_372 = false;
    }
  }
  else {
    pHVar3 = _::NullableValue<kj::HttpMethod>::operator*(&local_354);
    if (*pHVar3 != TRACE) {
      local_371 = _::Debug::shouldLog(ERROR);
      while (local_371 != false) {
        _::Debug::log<char_const(&)[46]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::TRACE\"",
                   (char (*) [46])"failed: expected *parsed == HttpMethod::TRACE");
        local_371 = false;
      }
    }
  }
  _::NullableValue<kj::HttpMethod>::~NullableValue(&local_354);
  local_394 = COPY;
  str<kj::HttpMethod>(&local_390,&local_394);
  StringPtr::StringPtr((StringPtr *)&parsed_9.field_1,"COPY");
  bVar1 = String::operator==(&local_390,(StringPtr *)&parsed_9.field_1);
  String::~String(&local_390);
  if (!bVar1) {
    parsed_9._3_1_ = _::Debug::shouldLog(ERROR);
    while (parsed_9._3_1_ != '\0') {
      _::Debug::log<char_const(&)[53]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::COPY) == \\\"COPY\\\"\"",
                 (char (*) [53])"failed: expected kj::str(HttpMethod::COPY) == \"COPY\"");
      parsed_9._3_1_ = 0;
    }
  }
  StringPtr::StringPtr((StringPtr *)auStack_3d0,"COPY");
  name_08.content.size_ = (size_t)_auStack_3d0;
  name_08.content.ptr = (char *)&local_3bc;
  tryParseHttpMethod(name_08);
  pNVar2 = _::readMaybe<kj::HttpMethod>(&local_3bc);
  _::NullableValue<kj::HttpMethod>::NullableValue(&local_3b4,pNVar2);
  Maybe<kj::HttpMethod>::~Maybe(&local_3bc);
  pHVar3 = _::NullableValue::operator_cast_to_HttpMethod_((NullableValue *)&local_3b4);
  if (pHVar3 == (HttpMethod *)0x0) {
    local_3d2 = _::Debug::shouldLog(ERROR);
    while (local_3d2 != false) {
      _::Debug::log<char_const(&)[36]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"COPY\" \"\\\" as HttpMethod\"",
                 (char (*) [36])"couldn\'t parse \"COPY\" as HttpMethod");
      local_3d2 = false;
    }
  }
  else {
    pHVar3 = _::NullableValue<kj::HttpMethod>::operator*(&local_3b4);
    if (*pHVar3 != COPY) {
      local_3d1 = _::Debug::shouldLog(ERROR);
      while (local_3d1 != false) {
        _::Debug::log<char_const(&)[45]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::COPY\"",
                   (char (*) [45])"failed: expected *parsed == HttpMethod::COPY");
        local_3d1 = false;
      }
    }
  }
  _::NullableValue<kj::HttpMethod>::~NullableValue(&local_3b4);
  local_3f4 = LOCK;
  str<kj::HttpMethod>(&local_3f0,&local_3f4);
  StringPtr::StringPtr((StringPtr *)&parsed_10.field_1,"LOCK");
  bVar1 = String::operator==(&local_3f0,(StringPtr *)&parsed_10.field_1);
  String::~String(&local_3f0);
  if (!bVar1) {
    parsed_10._3_1_ = _::Debug::shouldLog(ERROR);
    while (parsed_10._3_1_ != '\0') {
      _::Debug::log<char_const(&)[53]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::LOCK) == \\\"LOCK\\\"\"",
                 (char (*) [53])"failed: expected kj::str(HttpMethod::LOCK) == \"LOCK\"");
      parsed_10._3_1_ = 0;
    }
  }
  StringPtr::StringPtr((StringPtr *)auStack_430,"LOCK");
  name_09.content.size_ = (size_t)_auStack_430;
  name_09.content.ptr = (char *)&local_41c;
  tryParseHttpMethod(name_09);
  pNVar2 = _::readMaybe<kj::HttpMethod>(&local_41c);
  _::NullableValue<kj::HttpMethod>::NullableValue(&local_414,pNVar2);
  Maybe<kj::HttpMethod>::~Maybe(&local_41c);
  pHVar3 = _::NullableValue::operator_cast_to_HttpMethod_((NullableValue *)&local_414);
  if (pHVar3 == (HttpMethod *)0x0) {
    local_432 = _::Debug::shouldLog(ERROR);
    while (local_432 != false) {
      _::Debug::log<char_const(&)[36]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"LOCK\" \"\\\" as HttpMethod\"",
                 (char (*) [36])"couldn\'t parse \"LOCK\" as HttpMethod");
      local_432 = false;
    }
  }
  else {
    pHVar3 = _::NullableValue<kj::HttpMethod>::operator*(&local_414);
    if (*pHVar3 != LOCK) {
      local_431 = _::Debug::shouldLog(ERROR);
      while (local_431 != false) {
        _::Debug::log<char_const(&)[45]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::LOCK\"",
                   (char (*) [45])"failed: expected *parsed == HttpMethod::LOCK");
        local_431 = false;
      }
    }
  }
  _::NullableValue<kj::HttpMethod>::~NullableValue(&local_414);
  local_454 = MKCOL;
  str<kj::HttpMethod>(&local_450,&local_454);
  StringPtr::StringPtr((StringPtr *)&parsed_11.field_1,"MKCOL");
  bVar1 = String::operator==(&local_450,(StringPtr *)&parsed_11.field_1);
  String::~String(&local_450);
  if (!bVar1) {
    parsed_11._3_1_ = _::Debug::shouldLog(ERROR);
    while (parsed_11._3_1_ != '\0') {
      _::Debug::log<char_const(&)[55]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::MKCOL) == \\\"MKCOL\\\"\""
                 ,(char (*) [55])"failed: expected kj::str(HttpMethod::MKCOL) == \"MKCOL\"");
      parsed_11._3_1_ = 0;
    }
  }
  StringPtr::StringPtr((StringPtr *)auStack_490,"MKCOL");
  name_10.content.size_ = (size_t)_auStack_490;
  name_10.content.ptr = (char *)&local_47c;
  tryParseHttpMethod(name_10);
  pNVar2 = _::readMaybe<kj::HttpMethod>(&local_47c);
  _::NullableValue<kj::HttpMethod>::NullableValue(&local_474,pNVar2);
  Maybe<kj::HttpMethod>::~Maybe(&local_47c);
  pHVar3 = _::NullableValue::operator_cast_to_HttpMethod_((NullableValue *)&local_474);
  if (pHVar3 == (HttpMethod *)0x0) {
    local_492 = _::Debug::shouldLog(ERROR);
    while (local_492 != false) {
      _::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"MKCOL\" \"\\\" as HttpMethod\"",
                 (char (*) [37])"couldn\'t parse \"MKCOL\" as HttpMethod");
      local_492 = false;
    }
  }
  else {
    pHVar3 = _::NullableValue<kj::HttpMethod>::operator*(&local_474);
    if (*pHVar3 != MKCOL) {
      local_491 = _::Debug::shouldLog(ERROR);
      while (local_491 != false) {
        _::Debug::log<char_const(&)[46]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::MKCOL\"",
                   (char (*) [46])"failed: expected *parsed == HttpMethod::MKCOL");
        local_491 = false;
      }
    }
  }
  _::NullableValue<kj::HttpMethod>::~NullableValue(&local_474);
  local_4b4 = MOVE;
  str<kj::HttpMethod>(&local_4b0,&local_4b4);
  StringPtr::StringPtr((StringPtr *)&parsed_12.field_1,"MOVE");
  bVar1 = String::operator==(&local_4b0,(StringPtr *)&parsed_12.field_1);
  String::~String(&local_4b0);
  if (!bVar1) {
    parsed_12._3_1_ = _::Debug::shouldLog(ERROR);
    while (parsed_12._3_1_ != '\0') {
      _::Debug::log<char_const(&)[53]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::MOVE) == \\\"MOVE\\\"\"",
                 (char (*) [53])"failed: expected kj::str(HttpMethod::MOVE) == \"MOVE\"");
      parsed_12._3_1_ = 0;
    }
  }
  StringPtr::StringPtr((StringPtr *)auStack_4f0,"MOVE");
  name_11.content.size_ = (size_t)_auStack_4f0;
  name_11.content.ptr = (char *)&local_4dc;
  tryParseHttpMethod(name_11);
  pNVar2 = _::readMaybe<kj::HttpMethod>(&local_4dc);
  _::NullableValue<kj::HttpMethod>::NullableValue(&local_4d4,pNVar2);
  Maybe<kj::HttpMethod>::~Maybe(&local_4dc);
  pHVar3 = _::NullableValue::operator_cast_to_HttpMethod_((NullableValue *)&local_4d4);
  if (pHVar3 == (HttpMethod *)0x0) {
    local_4f2 = _::Debug::shouldLog(ERROR);
    while (local_4f2 != false) {
      _::Debug::log<char_const(&)[36]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"MOVE\" \"\\\" as HttpMethod\"",
                 (char (*) [36])"couldn\'t parse \"MOVE\" as HttpMethod");
      local_4f2 = false;
    }
  }
  else {
    pHVar3 = _::NullableValue<kj::HttpMethod>::operator*(&local_4d4);
    if (*pHVar3 != MOVE) {
      local_4f1 = _::Debug::shouldLog(ERROR);
      while (local_4f1 != false) {
        _::Debug::log<char_const(&)[45]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::MOVE\"",
                   (char (*) [45])"failed: expected *parsed == HttpMethod::MOVE");
        local_4f1 = false;
      }
    }
  }
  _::NullableValue<kj::HttpMethod>::~NullableValue(&local_4d4);
  local_514 = PROPFIND;
  str<kj::HttpMethod>(&local_510,&local_514);
  StringPtr::StringPtr((StringPtr *)&parsed_13.field_1,"PROPFIND");
  bVar1 = String::operator==(&local_510,(StringPtr *)&parsed_13.field_1);
  String::~String(&local_510);
  if (!bVar1) {
    parsed_13._3_1_ = _::Debug::shouldLog(ERROR);
    while (parsed_13._3_1_ != '\0') {
      _::Debug::log<char_const(&)[61]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,
                 "\"failed: expected \" \"kj::str(HttpMethod::PROPFIND) == \\\"PROPFIND\\\"\"",
                 (char (*) [61])"failed: expected kj::str(HttpMethod::PROPFIND) == \"PROPFIND\"");
      parsed_13._3_1_ = 0;
    }
  }
  StringPtr::StringPtr((StringPtr *)auStack_550,"PROPFIND");
  name_12.content.size_ = (size_t)_auStack_550;
  name_12.content.ptr = (char *)&local_53c;
  tryParseHttpMethod(name_12);
  pNVar2 = _::readMaybe<kj::HttpMethod>(&local_53c);
  _::NullableValue<kj::HttpMethod>::NullableValue(&local_534,pNVar2);
  Maybe<kj::HttpMethod>::~Maybe(&local_53c);
  pHVar3 = _::NullableValue::operator_cast_to_HttpMethod_((NullableValue *)&local_534);
  if (pHVar3 == (HttpMethod *)0x0) {
    local_552 = _::Debug::shouldLog(ERROR);
    while (local_552 != false) {
      _::Debug::log<char_const(&)[40]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"PROPFIND\" \"\\\" as HttpMethod\"",
                 (char (*) [40])"couldn\'t parse \"PROPFIND\" as HttpMethod");
      local_552 = false;
    }
  }
  else {
    pHVar3 = _::NullableValue<kj::HttpMethod>::operator*(&local_534);
    if (*pHVar3 != PROPFIND) {
      local_551 = _::Debug::shouldLog(ERROR);
      while (local_551 != false) {
        _::Debug::log<char_const(&)[49]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::PROPFIND\"",
                   (char (*) [49])"failed: expected *parsed == HttpMethod::PROPFIND");
        local_551 = false;
      }
    }
  }
  _::NullableValue<kj::HttpMethod>::~NullableValue(&local_534);
  local_574 = PROPPATCH;
  str<kj::HttpMethod>(&local_570,&local_574);
  StringPtr::StringPtr((StringPtr *)&parsed_14.field_1,"PROPPATCH");
  bVar1 = String::operator==(&local_570,(StringPtr *)&parsed_14.field_1);
  String::~String(&local_570);
  if (!bVar1) {
    parsed_14._3_1_ = _::Debug::shouldLog(ERROR);
    while (parsed_14._3_1_ != '\0') {
      _::Debug::log<char_const(&)[63]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,
                 "\"failed: expected \" \"kj::str(HttpMethod::PROPPATCH) == \\\"PROPPATCH\\\"\"",
                 (char (*) [63])"failed: expected kj::str(HttpMethod::PROPPATCH) == \"PROPPATCH\"");
      parsed_14._3_1_ = 0;
    }
  }
  StringPtr::StringPtr((StringPtr *)auStack_5b0,"PROPPATCH");
  name_13.content.size_ = (size_t)_auStack_5b0;
  name_13.content.ptr = (char *)&local_59c;
  tryParseHttpMethod(name_13);
  pNVar2 = _::readMaybe<kj::HttpMethod>(&local_59c);
  _::NullableValue<kj::HttpMethod>::NullableValue(&local_594,pNVar2);
  Maybe<kj::HttpMethod>::~Maybe(&local_59c);
  pHVar3 = _::NullableValue::operator_cast_to_HttpMethod_((NullableValue *)&local_594);
  if (pHVar3 == (HttpMethod *)0x0) {
    local_5b2 = _::Debug::shouldLog(ERROR);
    while (local_5b2 != false) {
      _::Debug::log<char_const(&)[41]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"PROPPATCH\" \"\\\" as HttpMethod\"",
                 (char (*) [41])"couldn\'t parse \"PROPPATCH\" as HttpMethod");
      local_5b2 = false;
    }
  }
  else {
    pHVar3 = _::NullableValue<kj::HttpMethod>::operator*(&local_594);
    if (*pHVar3 != PROPPATCH) {
      local_5b1 = _::Debug::shouldLog(ERROR);
      while (local_5b1 != false) {
        _::Debug::log<char_const(&)[50]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::PROPPATCH\"",
                   (char (*) [50])"failed: expected *parsed == HttpMethod::PROPPATCH");
        local_5b1 = false;
      }
    }
  }
  _::NullableValue<kj::HttpMethod>::~NullableValue(&local_594);
  local_5d4 = SEARCH;
  str<kj::HttpMethod>(&local_5d0,&local_5d4);
  StringPtr::StringPtr((StringPtr *)&parsed_15.field_1,"SEARCH");
  bVar1 = String::operator==(&local_5d0,(StringPtr *)&parsed_15.field_1);
  String::~String(&local_5d0);
  if (!bVar1) {
    parsed_15._3_1_ = _::Debug::shouldLog(ERROR);
    while (parsed_15._3_1_ != '\0') {
      _::Debug::log<char_const(&)[57]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,
                 "\"failed: expected \" \"kj::str(HttpMethod::SEARCH) == \\\"SEARCH\\\"\"",
                 (char (*) [57])"failed: expected kj::str(HttpMethod::SEARCH) == \"SEARCH\"");
      parsed_15._3_1_ = 0;
    }
  }
  StringPtr::StringPtr((StringPtr *)auStack_610,"SEARCH");
  name_14.content.size_ = (size_t)_auStack_610;
  name_14.content.ptr = (char *)&local_5fc;
  tryParseHttpMethod(name_14);
  pNVar2 = _::readMaybe<kj::HttpMethod>(&local_5fc);
  _::NullableValue<kj::HttpMethod>::NullableValue(&local_5f4,pNVar2);
  Maybe<kj::HttpMethod>::~Maybe(&local_5fc);
  pHVar3 = _::NullableValue::operator_cast_to_HttpMethod_((NullableValue *)&local_5f4);
  if (pHVar3 == (HttpMethod *)0x0) {
    local_612 = _::Debug::shouldLog(ERROR);
    while (local_612 != false) {
      _::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"SEARCH\" \"\\\" as HttpMethod\"",
                 (char (*) [38])"couldn\'t parse \"SEARCH\" as HttpMethod");
      local_612 = false;
    }
  }
  else {
    pHVar3 = _::NullableValue<kj::HttpMethod>::operator*(&local_5f4);
    if (*pHVar3 != SEARCH) {
      local_611 = _::Debug::shouldLog(ERROR);
      while (local_611 != false) {
        _::Debug::log<char_const(&)[47]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::SEARCH\"",
                   (char (*) [47])"failed: expected *parsed == HttpMethod::SEARCH");
        local_611 = false;
      }
    }
  }
  _::NullableValue<kj::HttpMethod>::~NullableValue(&local_5f4);
  local_634 = UNLOCK;
  str<kj::HttpMethod>(&local_630,&local_634);
  StringPtr::StringPtr((StringPtr *)&parsed_16.field_1,"UNLOCK");
  bVar1 = String::operator==(&local_630,(StringPtr *)&parsed_16.field_1);
  String::~String(&local_630);
  if (!bVar1) {
    parsed_16._3_1_ = _::Debug::shouldLog(ERROR);
    while (parsed_16._3_1_ != '\0') {
      _::Debug::log<char_const(&)[57]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,
                 "\"failed: expected \" \"kj::str(HttpMethod::UNLOCK) == \\\"UNLOCK\\\"\"",
                 (char (*) [57])"failed: expected kj::str(HttpMethod::UNLOCK) == \"UNLOCK\"");
      parsed_16._3_1_ = 0;
    }
  }
  StringPtr::StringPtr((StringPtr *)auStack_670,"UNLOCK");
  name_15.content.size_ = (size_t)_auStack_670;
  name_15.content.ptr = (char *)&local_65c;
  tryParseHttpMethod(name_15);
  pNVar2 = _::readMaybe<kj::HttpMethod>(&local_65c);
  _::NullableValue<kj::HttpMethod>::NullableValue(&local_654,pNVar2);
  Maybe<kj::HttpMethod>::~Maybe(&local_65c);
  pHVar3 = _::NullableValue::operator_cast_to_HttpMethod_((NullableValue *)&local_654);
  if (pHVar3 == (HttpMethod *)0x0) {
    local_672 = _::Debug::shouldLog(ERROR);
    while (local_672 != false) {
      _::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"UNLOCK\" \"\\\" as HttpMethod\"",
                 (char (*) [38])"couldn\'t parse \"UNLOCK\" as HttpMethod");
      local_672 = false;
    }
  }
  else {
    pHVar3 = _::NullableValue<kj::HttpMethod>::operator*(&local_654);
    if (*pHVar3 != UNLOCK) {
      local_671 = _::Debug::shouldLog(ERROR);
      while (local_671 != false) {
        _::Debug::log<char_const(&)[47]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::UNLOCK\"",
                   (char (*) [47])"failed: expected *parsed == HttpMethod::UNLOCK");
        local_671 = false;
      }
    }
  }
  _::NullableValue<kj::HttpMethod>::~NullableValue(&local_654);
  local_694 = ACL;
  str<kj::HttpMethod>(&local_690,&local_694);
  StringPtr::StringPtr((StringPtr *)&parsed_17.field_1,"ACL");
  bVar1 = String::operator==(&local_690,(StringPtr *)&parsed_17.field_1);
  String::~String(&local_690);
  if (!bVar1) {
    parsed_17._3_1_ = _::Debug::shouldLog(ERROR);
    while (parsed_17._3_1_ != '\0') {
      _::Debug::log<char_const(&)[51]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::ACL) == \\\"ACL\\\"\"",
                 (char (*) [51])"failed: expected kj::str(HttpMethod::ACL) == \"ACL\"");
      parsed_17._3_1_ = 0;
    }
  }
  StringPtr::StringPtr((StringPtr *)auStack_6d0,"ACL");
  name_16.content.size_ = (size_t)_auStack_6d0;
  name_16.content.ptr = (char *)&local_6bc;
  tryParseHttpMethod(name_16);
  pNVar2 = _::readMaybe<kj::HttpMethod>(&local_6bc);
  _::NullableValue<kj::HttpMethod>::NullableValue(&local_6b4,pNVar2);
  Maybe<kj::HttpMethod>::~Maybe(&local_6bc);
  pHVar3 = _::NullableValue::operator_cast_to_HttpMethod_((NullableValue *)&local_6b4);
  if (pHVar3 == (HttpMethod *)0x0) {
    local_6d2 = _::Debug::shouldLog(ERROR);
    while (local_6d2 != false) {
      _::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"ACL\" \"\\\" as HttpMethod\"",
                 (char (*) [35])"couldn\'t parse \"ACL\" as HttpMethod");
      local_6d2 = false;
    }
  }
  else {
    pHVar3 = _::NullableValue<kj::HttpMethod>::operator*(&local_6b4);
    if (*pHVar3 != ACL) {
      local_6d1 = _::Debug::shouldLog(ERROR);
      while (local_6d1 != false) {
        _::Debug::log<char_const(&)[44]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::ACL\"",
                   (char (*) [44])"failed: expected *parsed == HttpMethod::ACL");
        local_6d1 = false;
      }
    }
  }
  _::NullableValue<kj::HttpMethod>::~NullableValue(&local_6b4);
  local_6f4 = REPORT;
  str<kj::HttpMethod>(&local_6f0,&local_6f4);
  StringPtr::StringPtr((StringPtr *)&parsed_18.field_1,"REPORT");
  bVar1 = String::operator==(&local_6f0,(StringPtr *)&parsed_18.field_1);
  String::~String(&local_6f0);
  if (!bVar1) {
    parsed_18._3_1_ = _::Debug::shouldLog(ERROR);
    while (parsed_18._3_1_ != '\0') {
      _::Debug::log<char_const(&)[57]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,
                 "\"failed: expected \" \"kj::str(HttpMethod::REPORT) == \\\"REPORT\\\"\"",
                 (char (*) [57])"failed: expected kj::str(HttpMethod::REPORT) == \"REPORT\"");
      parsed_18._3_1_ = 0;
    }
  }
  StringPtr::StringPtr((StringPtr *)auStack_730,"REPORT");
  name_17.content.size_ = (size_t)_auStack_730;
  name_17.content.ptr = (char *)&local_71c;
  tryParseHttpMethod(name_17);
  pNVar2 = _::readMaybe<kj::HttpMethod>(&local_71c);
  _::NullableValue<kj::HttpMethod>::NullableValue(&local_714,pNVar2);
  Maybe<kj::HttpMethod>::~Maybe(&local_71c);
  pHVar3 = _::NullableValue::operator_cast_to_HttpMethod_((NullableValue *)&local_714);
  if (pHVar3 == (HttpMethod *)0x0) {
    local_732 = _::Debug::shouldLog(ERROR);
    while (local_732 != false) {
      _::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"REPORT\" \"\\\" as HttpMethod\"",
                 (char (*) [38])"couldn\'t parse \"REPORT\" as HttpMethod");
      local_732 = false;
    }
  }
  else {
    pHVar3 = _::NullableValue<kj::HttpMethod>::operator*(&local_714);
    if (*pHVar3 != REPORT) {
      local_731 = _::Debug::shouldLog(ERROR);
      while (local_731 != false) {
        _::Debug::log<char_const(&)[47]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::REPORT\"",
                   (char (*) [47])"failed: expected *parsed == HttpMethod::REPORT");
        local_731 = false;
      }
    }
  }
  _::NullableValue<kj::HttpMethod>::~NullableValue(&local_714);
  local_754 = MKACTIVITY;
  str<kj::HttpMethod>(&local_750,&local_754);
  StringPtr::StringPtr((StringPtr *)&parsed_19.field_1,"MKACTIVITY");
  bVar1 = String::operator==(&local_750,(StringPtr *)&parsed_19.field_1);
  String::~String(&local_750);
  if (!bVar1) {
    parsed_19._3_1_ = _::Debug::shouldLog(ERROR);
    while (parsed_19._3_1_ != '\0') {
      _::Debug::log<char_const(&)[65]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,
                 "\"failed: expected \" \"kj::str(HttpMethod::MKACTIVITY) == \\\"MKACTIVITY\\\"\"",
                 (char (*) [65])"failed: expected kj::str(HttpMethod::MKACTIVITY) == \"MKACTIVITY\""
                );
      parsed_19._3_1_ = 0;
    }
  }
  StringPtr::StringPtr((StringPtr *)auStack_790,"MKACTIVITY");
  name_18.content.size_ = (size_t)_auStack_790;
  name_18.content.ptr = (char *)&local_77c;
  tryParseHttpMethod(name_18);
  pNVar2 = _::readMaybe<kj::HttpMethod>(&local_77c);
  _::NullableValue<kj::HttpMethod>::NullableValue(&local_774,pNVar2);
  Maybe<kj::HttpMethod>::~Maybe(&local_77c);
  pHVar3 = _::NullableValue::operator_cast_to_HttpMethod_((NullableValue *)&local_774);
  if (pHVar3 == (HttpMethod *)0x0) {
    local_792 = _::Debug::shouldLog(ERROR);
    while (local_792 != false) {
      _::Debug::log<char_const(&)[42]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"MKACTIVITY\" \"\\\" as HttpMethod\"",
                 (char (*) [42])"couldn\'t parse \"MKACTIVITY\" as HttpMethod");
      local_792 = false;
    }
  }
  else {
    pHVar3 = _::NullableValue<kj::HttpMethod>::operator*(&local_774);
    if (*pHVar3 != MKACTIVITY) {
      local_791 = _::Debug::shouldLog(ERROR);
      while (local_791 != false) {
        _::Debug::log<char_const(&)[51]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::MKACTIVITY\"",
                   (char (*) [51])"failed: expected *parsed == HttpMethod::MKACTIVITY");
        local_791 = false;
      }
    }
  }
  _::NullableValue<kj::HttpMethod>::~NullableValue(&local_774);
  local_7b4 = CHECKOUT;
  str<kj::HttpMethod>(&local_7b0,&local_7b4);
  StringPtr::StringPtr((StringPtr *)&parsed_20.field_1,"CHECKOUT");
  bVar1 = String::operator==(&local_7b0,(StringPtr *)&parsed_20.field_1);
  String::~String(&local_7b0);
  if (!bVar1) {
    parsed_20._3_1_ = _::Debug::shouldLog(ERROR);
    while (parsed_20._3_1_ != '\0') {
      _::Debug::log<char_const(&)[61]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,
                 "\"failed: expected \" \"kj::str(HttpMethod::CHECKOUT) == \\\"CHECKOUT\\\"\"",
                 (char (*) [61])"failed: expected kj::str(HttpMethod::CHECKOUT) == \"CHECKOUT\"");
      parsed_20._3_1_ = 0;
    }
  }
  StringPtr::StringPtr((StringPtr *)auStack_7f0,"CHECKOUT");
  name_19.content.size_ = (size_t)_auStack_7f0;
  name_19.content.ptr = (char *)&local_7dc;
  tryParseHttpMethod(name_19);
  pNVar2 = _::readMaybe<kj::HttpMethod>(&local_7dc);
  _::NullableValue<kj::HttpMethod>::NullableValue(&local_7d4,pNVar2);
  Maybe<kj::HttpMethod>::~Maybe(&local_7dc);
  pHVar3 = _::NullableValue::operator_cast_to_HttpMethod_((NullableValue *)&local_7d4);
  if (pHVar3 == (HttpMethod *)0x0) {
    local_7f2 = _::Debug::shouldLog(ERROR);
    while (local_7f2 != false) {
      _::Debug::log<char_const(&)[40]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"CHECKOUT\" \"\\\" as HttpMethod\"",
                 (char (*) [40])"couldn\'t parse \"CHECKOUT\" as HttpMethod");
      local_7f2 = false;
    }
  }
  else {
    pHVar3 = _::NullableValue<kj::HttpMethod>::operator*(&local_7d4);
    if (*pHVar3 != CHECKOUT) {
      local_7f1 = _::Debug::shouldLog(ERROR);
      while (local_7f1 != false) {
        _::Debug::log<char_const(&)[49]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::CHECKOUT\"",
                   (char (*) [49])"failed: expected *parsed == HttpMethod::CHECKOUT");
        local_7f1 = false;
      }
    }
  }
  _::NullableValue<kj::HttpMethod>::~NullableValue(&local_7d4);
  local_814 = MERGE;
  str<kj::HttpMethod>(&local_810,&local_814);
  StringPtr::StringPtr((StringPtr *)&parsed_21.field_1,"MERGE");
  bVar1 = String::operator==(&local_810,(StringPtr *)&parsed_21.field_1);
  String::~String(&local_810);
  if (!bVar1) {
    parsed_21._3_1_ = _::Debug::shouldLog(ERROR);
    while (parsed_21._3_1_ != '\0') {
      _::Debug::log<char_const(&)[55]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::MERGE) == \\\"MERGE\\\"\""
                 ,(char (*) [55])"failed: expected kj::str(HttpMethod::MERGE) == \"MERGE\"");
      parsed_21._3_1_ = 0;
    }
  }
  StringPtr::StringPtr((StringPtr *)auStack_850,"MERGE");
  name_20.content.size_ = (size_t)_auStack_850;
  name_20.content.ptr = (char *)&local_83c;
  tryParseHttpMethod(name_20);
  pNVar2 = _::readMaybe<kj::HttpMethod>(&local_83c);
  _::NullableValue<kj::HttpMethod>::NullableValue(&local_834,pNVar2);
  Maybe<kj::HttpMethod>::~Maybe(&local_83c);
  pHVar3 = _::NullableValue::operator_cast_to_HttpMethod_((NullableValue *)&local_834);
  if (pHVar3 == (HttpMethod *)0x0) {
    local_852 = _::Debug::shouldLog(ERROR);
    while (local_852 != false) {
      _::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"MERGE\" \"\\\" as HttpMethod\"",
                 (char (*) [37])"couldn\'t parse \"MERGE\" as HttpMethod");
      local_852 = false;
    }
  }
  else {
    pHVar3 = _::NullableValue<kj::HttpMethod>::operator*(&local_834);
    if (*pHVar3 != MERGE) {
      local_851 = _::Debug::shouldLog(ERROR);
      while (local_851 != false) {
        _::Debug::log<char_const(&)[46]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::MERGE\"",
                   (char (*) [46])"failed: expected *parsed == HttpMethod::MERGE");
        local_851 = false;
      }
    }
  }
  _::NullableValue<kj::HttpMethod>::~NullableValue(&local_834);
  local_874 = MSEARCH;
  str<kj::HttpMethod>(&local_870,&local_874);
  StringPtr::StringPtr((StringPtr *)&parsed_22.field_1,"MSEARCH");
  bVar1 = String::operator==(&local_870,(StringPtr *)&parsed_22.field_1);
  String::~String(&local_870);
  if (!bVar1) {
    parsed_22._3_1_ = _::Debug::shouldLog(ERROR);
    while (parsed_22._3_1_ != '\0') {
      _::Debug::log<char_const(&)[59]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,
                 "\"failed: expected \" \"kj::str(HttpMethod::MSEARCH) == \\\"MSEARCH\\\"\"",
                 (char (*) [59])"failed: expected kj::str(HttpMethod::MSEARCH) == \"MSEARCH\"");
      parsed_22._3_1_ = 0;
    }
  }
  StringPtr::StringPtr((StringPtr *)auStack_8b0,"MSEARCH");
  name_21.content.size_ = (size_t)_auStack_8b0;
  name_21.content.ptr = (char *)&local_89c;
  tryParseHttpMethod(name_21);
  pNVar2 = _::readMaybe<kj::HttpMethod>(&local_89c);
  _::NullableValue<kj::HttpMethod>::NullableValue(&local_894,pNVar2);
  Maybe<kj::HttpMethod>::~Maybe(&local_89c);
  pHVar3 = _::NullableValue::operator_cast_to_HttpMethod_((NullableValue *)&local_894);
  if (pHVar3 == (HttpMethod *)0x0) {
    local_8b2 = _::Debug::shouldLog(ERROR);
    while (local_8b2 != false) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"MSEARCH\" \"\\\" as HttpMethod\"",
                 (char (*) [39])"couldn\'t parse \"MSEARCH\" as HttpMethod");
      local_8b2 = false;
    }
  }
  else {
    pHVar3 = _::NullableValue<kj::HttpMethod>::operator*(&local_894);
    if (*pHVar3 != MSEARCH) {
      local_8b1 = _::Debug::shouldLog(ERROR);
      while (local_8b1 != false) {
        _::Debug::log<char_const(&)[48]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::MSEARCH\"",
                   (char (*) [48])"failed: expected *parsed == HttpMethod::MSEARCH");
        local_8b1 = false;
      }
    }
  }
  _::NullableValue<kj::HttpMethod>::~NullableValue(&local_894);
  local_8d4 = NOTIFY;
  str<kj::HttpMethod>(&local_8d0,&local_8d4);
  StringPtr::StringPtr((StringPtr *)&parsed_23.field_1,"NOTIFY");
  bVar1 = String::operator==(&local_8d0,(StringPtr *)&parsed_23.field_1);
  String::~String(&local_8d0);
  if (!bVar1) {
    parsed_23._3_1_ = _::Debug::shouldLog(ERROR);
    while (parsed_23._3_1_ != '\0') {
      _::Debug::log<char_const(&)[57]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,
                 "\"failed: expected \" \"kj::str(HttpMethod::NOTIFY) == \\\"NOTIFY\\\"\"",
                 (char (*) [57])"failed: expected kj::str(HttpMethod::NOTIFY) == \"NOTIFY\"");
      parsed_23._3_1_ = 0;
    }
  }
  StringPtr::StringPtr((StringPtr *)auStack_910,"NOTIFY");
  name_22.content.size_ = (size_t)_auStack_910;
  name_22.content.ptr = (char *)&local_8fc;
  tryParseHttpMethod(name_22);
  pNVar2 = _::readMaybe<kj::HttpMethod>(&local_8fc);
  _::NullableValue<kj::HttpMethod>::NullableValue(&local_8f4,pNVar2);
  Maybe<kj::HttpMethod>::~Maybe(&local_8fc);
  pHVar3 = _::NullableValue::operator_cast_to_HttpMethod_((NullableValue *)&local_8f4);
  if (pHVar3 == (HttpMethod *)0x0) {
    local_912 = _::Debug::shouldLog(ERROR);
    while (local_912 != false) {
      _::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"NOTIFY\" \"\\\" as HttpMethod\"",
                 (char (*) [38])"couldn\'t parse \"NOTIFY\" as HttpMethod");
      local_912 = false;
    }
  }
  else {
    pHVar3 = _::NullableValue<kj::HttpMethod>::operator*(&local_8f4);
    if (*pHVar3 != NOTIFY) {
      local_911 = _::Debug::shouldLog(ERROR);
      while (local_911 != false) {
        _::Debug::log<char_const(&)[47]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::NOTIFY\"",
                   (char (*) [47])"failed: expected *parsed == HttpMethod::NOTIFY");
        local_911 = false;
      }
    }
  }
  _::NullableValue<kj::HttpMethod>::~NullableValue(&local_8f4);
  local_934 = SUBSCRIBE;
  str<kj::HttpMethod>(&local_930,&local_934);
  StringPtr::StringPtr((StringPtr *)&parsed_24.field_1,"SUBSCRIBE");
  bVar1 = String::operator==(&local_930,(StringPtr *)&parsed_24.field_1);
  String::~String(&local_930);
  if (!bVar1) {
    parsed_24._3_1_ = _::Debug::shouldLog(ERROR);
    while (parsed_24._3_1_ != '\0') {
      _::Debug::log<char_const(&)[63]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,
                 "\"failed: expected \" \"kj::str(HttpMethod::SUBSCRIBE) == \\\"SUBSCRIBE\\\"\"",
                 (char (*) [63])"failed: expected kj::str(HttpMethod::SUBSCRIBE) == \"SUBSCRIBE\"");
      parsed_24._3_1_ = 0;
    }
  }
  StringPtr::StringPtr((StringPtr *)auStack_970,"SUBSCRIBE");
  name_23.content.size_ = (size_t)_auStack_970;
  name_23.content.ptr = (char *)&local_95c;
  tryParseHttpMethod(name_23);
  pNVar2 = _::readMaybe<kj::HttpMethod>(&local_95c);
  _::NullableValue<kj::HttpMethod>::NullableValue(&local_954,pNVar2);
  Maybe<kj::HttpMethod>::~Maybe(&local_95c);
  pHVar3 = _::NullableValue::operator_cast_to_HttpMethod_((NullableValue *)&local_954);
  if (pHVar3 == (HttpMethod *)0x0) {
    local_972 = _::Debug::shouldLog(ERROR);
    while (local_972 != false) {
      _::Debug::log<char_const(&)[41]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"SUBSCRIBE\" \"\\\" as HttpMethod\"",
                 (char (*) [41])"couldn\'t parse \"SUBSCRIBE\" as HttpMethod");
      local_972 = false;
    }
  }
  else {
    pHVar3 = _::NullableValue<kj::HttpMethod>::operator*(&local_954);
    if (*pHVar3 != SUBSCRIBE) {
      local_971 = _::Debug::shouldLog(ERROR);
      while (local_971 != false) {
        _::Debug::log<char_const(&)[50]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::SUBSCRIBE\"",
                   (char (*) [50])"failed: expected *parsed == HttpMethod::SUBSCRIBE");
        local_971 = false;
      }
    }
  }
  _::NullableValue<kj::HttpMethod>::~NullableValue(&local_954);
  local_994 = UNSUBSCRIBE;
  str<kj::HttpMethod>(&local_990,&local_994);
  StringPtr::StringPtr((StringPtr *)&parsed_25.field_1,"UNSUBSCRIBE");
  bVar1 = String::operator==(&local_990,(StringPtr *)&parsed_25.field_1);
  String::~String(&local_990);
  if (!bVar1) {
    parsed_25._3_1_ = _::Debug::shouldLog(ERROR);
    while (parsed_25._3_1_ != '\0') {
      _::Debug::log<char_const(&)[67]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,
                 "\"failed: expected \" \"kj::str(HttpMethod::UNSUBSCRIBE) == \\\"UNSUBSCRIBE\\\"\""
                 ,(char (*) [67])
                  "failed: expected kj::str(HttpMethod::UNSUBSCRIBE) == \"UNSUBSCRIBE\"");
      parsed_25._3_1_ = 0;
    }
  }
  StringPtr::StringPtr((StringPtr *)auStack_9d0,"UNSUBSCRIBE");
  name_24.content.size_ = (size_t)_auStack_9d0;
  name_24.content.ptr = (char *)&local_9bc;
  tryParseHttpMethod(name_24);
  pNVar2 = _::readMaybe<kj::HttpMethod>(&local_9bc);
  _::NullableValue<kj::HttpMethod>::NullableValue(&local_9b4,pNVar2);
  Maybe<kj::HttpMethod>::~Maybe(&local_9bc);
  pHVar3 = _::NullableValue::operator_cast_to_HttpMethod_((NullableValue *)&local_9b4);
  if (pHVar3 == (HttpMethod *)0x0) {
    local_9d2 = _::Debug::shouldLog(ERROR);
    while (local_9d2 != false) {
      _::Debug::log<char_const(&)[43]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"UNSUBSCRIBE\" \"\\\" as HttpMethod\"",
                 (char (*) [43])"couldn\'t parse \"UNSUBSCRIBE\" as HttpMethod");
      local_9d2 = false;
    }
  }
  else {
    pHVar3 = _::NullableValue<kj::HttpMethod>::operator*(&local_9b4);
    if (*pHVar3 != UNSUBSCRIBE) {
      local_9d1 = _::Debug::shouldLog(ERROR);
      while (local_9d1 != false) {
        _::Debug::log<char_const(&)[52]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::UNSUBSCRIBE\"",
                   (char (*) [52])"failed: expected *parsed == HttpMethod::UNSUBSCRIBE");
        local_9d1 = false;
      }
    }
  }
  _::NullableValue<kj::HttpMethod>::~NullableValue(&local_9b4);
  StringPtr::StringPtr((StringPtr *)auStack_9f0,"FOO");
  name_25.content.size_ = (size_t)_auStack_9f0;
  name_25.content.ptr = (char *)&local_9dc;
  tryParseHttpMethod(name_25);
  bVar1 = Maybe<kj::HttpMethod>::operator==(&local_9dc,(void *)0x0);
  Maybe<kj::HttpMethod>::~Maybe(&local_9dc);
  if (!bVar1) {
    local_9f1 = _::Debug::shouldLog(ERROR);
    while (local_9f1 != false) {
      _::Debug::log<char_const(&)[54]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x3c,ERROR,"\"failed: expected \" \"tryParseHttpMethod(\\\"FOO\\\") == nullptr\"",
                 (char (*) [54])"failed: expected tryParseHttpMethod(\"FOO\") == nullptr");
      local_9f1 = false;
    }
  }
  StringPtr::StringPtr((StringPtr *)auStack_a10,"");
  name_26.content.size_ = (size_t)_auStack_a10;
  name_26.content.ptr = (char *)&local_9fc;
  tryParseHttpMethod(name_26);
  bVar1 = Maybe<kj::HttpMethod>::operator==(&local_9fc,(void *)0x0);
  Maybe<kj::HttpMethod>::~Maybe(&local_9fc);
  if (!bVar1) {
    local_a11 = _::Debug::shouldLog(ERROR);
    while (local_a11 != false) {
      _::Debug::log<char_const(&)[51]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x3d,ERROR,"\"failed: expected \" \"tryParseHttpMethod(\\\"\\\") == nullptr\"",
                 (char (*) [51])"failed: expected tryParseHttpMethod(\"\") == nullptr");
      local_a11 = false;
    }
  }
  StringPtr::StringPtr((StringPtr *)auStack_a30,"G");
  name_27.content.size_ = (size_t)_auStack_a30;
  name_27.content.ptr = (char *)&local_a1c;
  tryParseHttpMethod(name_27);
  bVar1 = Maybe<kj::HttpMethod>::operator==(&local_a1c,(void *)0x0);
  Maybe<kj::HttpMethod>::~Maybe(&local_a1c);
  if (!bVar1) {
    local_a31 = _::Debug::shouldLog(ERROR);
    while (local_a31 != false) {
      _::Debug::log<char_const(&)[52]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x3e,ERROR,"\"failed: expected \" \"tryParseHttpMethod(\\\"G\\\") == nullptr\"",
                 (char (*) [52])"failed: expected tryParseHttpMethod(\"G\") == nullptr");
      local_a31 = false;
    }
  }
  StringPtr::StringPtr((StringPtr *)auStack_a50,"GE");
  name_28.content.size_ = (size_t)_auStack_a50;
  name_28.content.ptr = (char *)&local_a3c;
  tryParseHttpMethod(name_28);
  bVar1 = Maybe<kj::HttpMethod>::operator==(&local_a3c,(void *)0x0);
  Maybe<kj::HttpMethod>::~Maybe(&local_a3c);
  if (!bVar1) {
    local_a51 = _::Debug::shouldLog(ERROR);
    while (local_a51 != false) {
      _::Debug::log<char_const(&)[53]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x3f,ERROR,"\"failed: expected \" \"tryParseHttpMethod(\\\"GE\\\") == nullptr\"",
                 (char (*) [53])"failed: expected tryParseHttpMethod(\"GE\") == nullptr");
      local_a51 = false;
    }
  }
  StringPtr::StringPtr((StringPtr *)auStack_a70,"GET ");
  name_29.content.size_ = (size_t)_auStack_a70;
  name_29.content.ptr = (char *)&local_a5c;
  tryParseHttpMethod(name_29);
  bVar1 = Maybe<kj::HttpMethod>::operator==(&local_a5c,(void *)0x0);
  Maybe<kj::HttpMethod>::~Maybe(&local_a5c);
  if (!bVar1) {
    local_a71 = _::Debug::shouldLog(ERROR);
    while (local_a71 != false) {
      _::Debug::log<char_const(&)[55]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x40,ERROR,"\"failed: expected \" \"tryParseHttpMethod(\\\"GET \\\") == nullptr\""
                 ,(char (*) [55])"failed: expected tryParseHttpMethod(\"GET \") == nullptr");
      local_a71 = false;
    }
  }
  StringPtr::StringPtr((StringPtr *)auStack_a90,"get");
  name_30.content.size_ = (size_t)_auStack_a90;
  name_30.content.ptr = (char *)&local_a7c;
  tryParseHttpMethod(name_30);
  bVar1 = Maybe<kj::HttpMethod>::operator==(&local_a7c,(void *)0x0);
  Maybe<kj::HttpMethod>::~Maybe(&local_a7c);
  if (!bVar1) {
    local_a91 = _::Debug::shouldLog(ERROR);
    while (local_a91 != false) {
      _::Debug::log<char_const(&)[54]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x41,ERROR,"\"failed: expected \" \"tryParseHttpMethod(\\\"get\\\") == nullptr\"",
                 (char (*) [54])"failed: expected tryParseHttpMethod(\"get\") == nullptr");
      local_a91 = false;
    }
  }
  return;
}

Assistant:

TEST(Async, EvalInt) {
  EventLoop loop;
  WaitScope waitScope(loop);

  bool done = false;

  Promise<int> promise = evalLater([&]() { done = true; return 123; });
  EXPECT_FALSE(done);
  EXPECT_EQ(123, promise.wait(waitScope));
  EXPECT_TRUE(done);
}